

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

QVariant * __thiscall
QTreeModel::data(QVariant *__return_storage_ptr__,QTreeModel *this,QModelIndex *index,int role)

{
  if ((((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) ||
     ((long *)index->i == (long *)0x0 || (index->m).ptr == (QAbstractItemModel *)0x0)) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    (**(code **)(*(long *)index->i + 0x18))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QTreeModel::data(const QModelIndex &index, int role) const
{
    if (!index.isValid())
        return QVariant();
    QTreeWidgetItem *itm = item(index);
    if (itm)
        return itm->data(index.column(), role);
    return QVariant();
}